

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O1

int IoTHubTransport_MQTT_Common_Subscribe_InputQueue(TRANSPORT_LL_HANDLE handle)

{
  char *pcVar1;
  char *pcVar2;
  STRING_HANDLE pSVar3;
  LOGGER_LOG p_Var4;
  int iVar5;
  int iVar6;
  
  if (handle == (TRANSPORT_LL_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    iVar6 = 0xfdb;
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return 0xfdb;
    }
    pcVar1 = "Invalid handle parameter. NULL.";
    iVar5 = 0xfda;
  }
  else {
    if (*(long *)((long)handle + 0x48) != 0) {
      if (*(long *)((long)handle + 0x20) == 0) {
        pcVar1 = STRING_c_str(*(STRING_HANDLE *)((long)handle + 0x40));
        pcVar2 = STRING_c_str(*(STRING_HANDLE *)((long)handle + 0x48));
        pSVar3 = STRING_construct_sprintf("devices/%s/modules/%s/#",pcVar1,pcVar2);
        *(STRING_HANDLE *)((long)handle + 0x20) = pSVar3;
        if (pSVar3 == (STRING_HANDLE)0x0) {
          p_Var4 = xlogging_get_log_function();
          iVar6 = 0xfe6;
          if (p_Var4 == (LOGGER_LOG)0x0) {
            return 0xfe6;
          }
          pcVar1 = "Failure constructing Message Topic";
          iVar5 = 0xfe5;
          goto LAB_0012e29a;
        }
      }
      *(byte *)((long)handle + 0x30) = *(byte *)((long)handle + 0x30) | 0x10;
      iVar6 = *(int *)((long)handle + 0xf0);
      if (iVar6 - 0xe0U < 2) {
        return 0;
      }
      if (iVar6 == 0x10) {
        return 0;
      }
      if (iVar6 == 0x20) {
        return 0;
      }
      *(undefined4 *)((long)handle + 0xf0) = 0x80;
      return 0;
    }
    p_Var4 = xlogging_get_log_function();
    iVar6 = 0xfe0;
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return 0xfe0;
    }
    pcVar1 = "ModuleID must be specified for input queues. NULL.";
    iVar5 = 0xfdf;
  }
LAB_0012e29a:
  (*p_Var4)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
            ,"IoTHubTransport_MQTT_Common_Subscribe_InputQueue",iVar5,1,pcVar1);
  return iVar6;
}

Assistant:

int IoTHubTransport_MQTT_Common_Subscribe_InputQueue(TRANSPORT_LL_HANDLE handle)
{
    int result;
    PMQTTTRANSPORT_HANDLE_DATA transport_data = (PMQTTTRANSPORT_HANDLE_DATA)handle;
    if (transport_data == NULL)
    {
        LogError("Invalid handle parameter. NULL.");
        result = MU_FAILURE;
    }
    else if (transport_data->module_id == NULL)
    {
        LogError("ModuleID must be specified for input queues. NULL.");
        result = MU_FAILURE;
    }
    else if ((transport_data->topic_InputQueue == NULL) &&
        (transport_data->topic_InputQueue = STRING_construct_sprintf(TOPIC_INPUT_QUEUE_NAME, STRING_c_str(transport_data->device_id), STRING_c_str(transport_data->module_id))) == NULL)
    {
        LogError("Failure constructing Message Topic");
        result = MU_FAILURE;
    }
    else
    {
        transport_data->topics_ToSubscribe |= SUBSCRIBE_INPUT_QUEUE_TOPIC;
        changeStateToSubscribeIfAllowed(transport_data);
        result = 0;
    }
    return result;
}